

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int begin_record_message(ptls_message_emitter_t *_self)

{
  int iVar1;
  long *in_RDI;
  int ret;
  st_ptls_record_message_emitter_t *self;
  size_t in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffec;
  
  in_RDI[5] = *(long *)(*in_RDI + 0x10);
  iVar1 = ptls_buffer__do_pushv
                    ((ptls_buffer_t *)CONCAT44(in_stack_ffffffffffffffec,0x303),
                     (void *)CONCAT17(0x16,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int begin_record_message(ptls_message_emitter_t *_self)
{
    struct st_ptls_record_message_emitter_t *self = (void *)_self;
    int ret;

    self->rec_start = self->super.buf->off;
    ptls_buffer_push(self->super.buf, PTLS_CONTENT_TYPE_HANDSHAKE, PTLS_RECORD_VERSION_MAJOR, PTLS_RECORD_VERSION_MINOR, 0, 0);
    ret = 0;
Exit:
    return ret;
}